

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

QPageSize * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,QSize *sizePoints)

{
  QSize *in_RDX;
  QPlatformPrintDevice *in_RSI;
  QPageSize *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_28 [24];
  QPageSize local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI->m_havePageSizes & 1U) == 0) {
    (*in_RSI->_vptr_QPlatformPrintDevice[0x26])();
  }
  QString::QString((QString *)0x132459);
  QPageSize::QPageSize(local_10,in_RDX,(QString *)local_28,FuzzyMatch);
  supportedPageSizeMatch(in_RSI,in_RDI);
  QPageSize::~QPageSize(local_10);
  QString::~QString((QString *)0x13249c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(const QSize &sizePoints) const
{
    if (!m_havePageSizes)
        loadPageSizes();

    // Try to find a supported page size based on fuzzy-matched point size
    return supportedPageSizeMatch(QPageSize(sizePoints));
}